

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O3

ssize_t __thiscall bsplib::A2A::send(A2A *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  pointer puVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pcVar12;
  ulong uVar13;
  
  if (__fd < 0) {
    __assert_fail("dst_pid >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x47,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  uVar5 = (ulong)(uint)__fd;
  uVar1 = this->m_nprocs;
  if ((int)uVar1 <= __fd) {
    __assert_fail("dst_pid < m_nprocs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x48,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  uVar10 = this->m_send_cap;
  pcVar12 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar10 != (ulong)((long)(this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pcVar12) /
                (ulong)uVar1) {
    __assert_fail("m_send_cap == m_send_bufs.size() / m_nprocs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x4a,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  puVar9 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = puVar9[uVar5];
  uVar11 = __n + uVar2;
  if (uVar10 < uVar11) {
    uVar13 = uVar10 * 2;
    if (uVar10 * 2 <= uVar11) {
      uVar13 = uVar11;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_send_bufs,uVar1 * uVar13);
    lVar7 = (long)this->m_nprocs;
    lVar6 = lVar7;
    if (0 < lVar7) {
      do {
        uVar10 = uVar13 * lVar7;
        uVar11 = uVar13 * (lVar7 + -1);
        if (uVar11 <= uVar10 && uVar10 - uVar11 != 0) {
          sVar3 = this->m_send_cap;
          do {
            pcVar12 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pcVar12[uVar10 - 1] = pcVar12[(sVar3 - uVar13) * (lVar6 + -1) + -1 + uVar10];
            uVar10 = uVar10 - 1;
          } while (uVar11 < uVar10);
        }
        bVar4 = 1 < lVar7;
        lVar7 = lVar7 + -1;
        lVar6 = lVar6 + -1;
      } while (bVar4);
    }
    this->m_send_cap = uVar13;
    puVar9 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar11 = puVar9[uVar5] + __n;
  }
  puVar9[uVar5] = uVar11;
  pvVar8 = memcpy(pcVar12 + uVar5 * this->m_send_cap + uVar2,__buf,__n);
  return (ssize_t)pvVar8;
}

Assistant:

void * A2A::send( int dst_pid, const void * data, std::size_t size )
{
    assert( dst_pid >= 0 );
    assert( dst_pid < m_nprocs );

    assert( m_send_cap == m_send_bufs.size() / m_nprocs );

    std::size_t offset = m_send_sizes[ dst_pid ];
    if ( m_send_cap < offset + size ) {
        std::size_t new_cap =
           std::max( 2 * m_send_cap , offset + size );

        m_send_bufs.resize( m_nprocs * new_cap );
        for ( int p = m_nprocs; p > 0; --p ) {
            std::size_t displ = new_cap - m_send_cap;

            for ( size_t i = p*new_cap; i > (p-1)*new_cap; --i) {
                m_send_bufs[i-1] = m_send_bufs[i-displ*(p-1)-1];
            }
        }  
        m_send_cap = new_cap;
    }
    m_send_sizes[ dst_pid ] += size;
    void * send_buf = m_send_bufs.data() + dst_pid * m_send_cap + offset;
    std::memcpy( send_buf , data, size );
    return send_buf;
}